

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O0

QWidget * __thiscall QtMWidgets::ScrollArea::takeWidget(ScrollArea *this)

{
  ScrollAreaPrivate *pSVar1;
  QWidget *pQVar2;
  QWidget *w;
  ScrollAreaPrivate *d;
  ScrollArea *this_local;
  
  pSVar1 = d_func(this);
  pQVar2 = QPointer::operator_cast_to_QWidget_((QPointer *)&pSVar1->widget);
  QObject::removeEventFilter((QObject *)pQVar2);
  QWidget::setParent(&((pSVar1->super_AbstractScrollAreaPrivate).horIndicator)->super_QWidget);
  QWidget::setParent(&((pSVar1->super_AbstractScrollAreaPrivate).vertIndicator)->super_QWidget);
  QWidget::setParent(&((pSVar1->super_AbstractScrollAreaPrivate).horBlur)->super_QWidget);
  QWidget::setParent(&((pSVar1->super_AbstractScrollAreaPrivate).vertBlur)->super_QWidget);
  QPointer<QWidget>::operator=(&pSVar1->widget,(QWidget *)0x0);
  if (pQVar2 != (QWidget *)0x0) {
    QWidget::setParent(pQVar2);
  }
  return pQVar2;
}

Assistant:

QWidget *
ScrollArea::takeWidget()
{
	ScrollAreaPrivate * d = d_func();
	QWidget * w = d->widget;
	w->removeEventFilter( this );
	d->horIndicator->setParent( d->viewport );
	d->vertIndicator->setParent( d->viewport );
	d->horBlur->setParent( d->viewport );
	d->vertBlur->setParent( d->viewport );
	d->widget = 0;
	if( w )
		w->setParent( 0 );
	return w;
}